

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timestamp.cc
# Opt level: O0

string * __thiscall
muduo::Timestamp::toFormattedString_abi_cxx11_(Timestamp *this,bool showMicroseconds)

{
  byte in_DL;
  long *in_RSI;
  string *in_RDI;
  int microseconds;
  tm tm_time;
  time_t seconds;
  char buf [64];
  allocator local_ad;
  undefined4 local_ac;
  tm local_a8;
  long local_70;
  char local_68 [79];
  byte local_19;
  
  local_19 = in_DL & 1;
  memset(local_68,0,0x40);
  local_70 = *in_RSI / 1000000;
  gmtime_r(&local_70,&local_a8);
  if ((local_19 & 1) == 0) {
    snprintf(local_68,0x40,"%4d%02d%02d %02d:%02d:%02d",(ulong)(local_a8.tm_year + 0x76c),
             (ulong)(local_a8.tm_mon + 1),(ulong)(uint)local_a8.tm_mday,local_a8.tm_hour,
             local_a8.tm_min,local_a8.tm_sec);
  }
  else {
    local_ac = (undefined4)(*in_RSI % 1000000);
    snprintf(local_68,0x40,"%4d%02d%02d %02d:%02d:%02d.%06d",(ulong)(local_a8.tm_year + 0x76c),
             (ulong)(local_a8.tm_mon + 1),(ulong)(uint)local_a8.tm_mday,local_a8.tm_hour,
             local_a8.tm_min,local_a8.tm_sec,local_ac);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_68,&local_ad);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad);
  return in_RDI;
}

Assistant:

string Timestamp::toFormattedString(bool showMicroseconds) const
{
  char buf[64] = {0};
  time_t seconds = static_cast<time_t>(microSecondsSinceEpoch_ / kMicroSecondsPerSecond);
  struct tm tm_time;
  gmtime_r(&seconds, &tm_time);

  if (showMicroseconds)
  {
    int microseconds = static_cast<int>(microSecondsSinceEpoch_ % kMicroSecondsPerSecond);
    snprintf(buf, sizeof(buf), "%4d%02d%02d %02d:%02d:%02d.%06d",
             tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
             tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec,
             microseconds);
  }
  else
  {
    snprintf(buf, sizeof(buf), "%4d%02d%02d %02d:%02d:%02d",
             tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
             tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec);
  }
  return buf;
}